

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O0

void highbd_12_obmc_variance
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
               int *sum)

{
  int in_R8D;
  int in_R9D;
  undefined4 *in_stack_00000008;
  undefined4 *in_stack_00000010;
  int h_per_ovf;
  int max_pel_allowed_per_ovf;
  uint64_t sse64;
  int64_t sum64;
  uint64_t *in_stack_00000058;
  int in_stack_00000074;
  uint8_t *in_stack_00000078;
  int64_t *in_stack_000000d0;
  uint64_t *in_stack_000000d8;
  int32_t *in_stack_000000e0;
  int32_t *in_stack_000000e8;
  int in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  int in_stack_00000160;
  int in_stack_00000270;
  int in_stack_00000278;
  undefined4 local_28;
  
  if (in_R8D == 4) {
    hbd_obmc_variance_w4
              (in_stack_00000078,in_stack_00000074,sum,(int32_t *)sse,in_stack_00000058,
               (int64_t *)pre8,in_stack_00000160);
  }
  else if (in_R8D * in_R9D < 0x201) {
    hbd_obmc_variance_w8n
              (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,
               in_stack_000000d8,in_stack_000000d0,in_stack_00000270,in_stack_00000278);
  }
  else {
    local_28 = in_R9D;
    do {
      hbd_obmc_variance_w8n
                (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,
                 in_stack_000000d8,in_stack_000000d0,in_stack_00000270,in_stack_00000278);
      local_28 = local_28 - 0x200 / in_R8D;
    } while (0 < local_28);
  }
  *in_stack_00000010 = 0;
  *in_stack_00000008 = 0;
  return;
}

Assistant:

static inline void highbd_12_obmc_variance(const uint8_t *pre8, int pre_stride,
                                           const int32_t *wsrc,
                                           const int32_t *mask, int w, int h,
                                           unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  int max_pel_allowed_per_ovf = 512;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else if (w * h <= max_pel_allowed_per_ovf) {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  } else {
    int h_per_ovf = max_pel_allowed_per_ovf / w;

    assert(max_pel_allowed_per_ovf % w == 0);
    do {
      hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w,
                            h_per_ovf);
      pre8 += h_per_ovf * pre_stride;
      wsrc += h_per_ovf * w;
      mask += h_per_ovf * w;
      h -= h_per_ovf;
    } while (h > 0);
  }
  *sum = (int)ROUND_POWER_OF_TWO(sum64, 4);
  *sse = (unsigned int)ROUND_POWER_OF_TWO(sse64, 8);
}